

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.h
# Opt level: O1

optional<uuids::uuid> * __thiscall
uuids::uuid::from_string<wchar_t_const*>
          (optional<uuids::uuid> *__return_storage_ptr__,uuid *this,wchar_t **in_str)

{
  uint uVar1;
  wchar_t wVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  char cVar7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  wchar_t *__s;
  bool bVar11;
  array<unsigned_char,_16UL> data;
  undefined8 local_28;
  undefined8 uStack_20;
  
  __s = *(wchar_t **)(this->data)._M_elems;
  if (__s == (wchar_t *)0x0) {
    sVar3 = 0;
    __s = (wchar_t *)0x0;
  }
  else {
    sVar3 = wcslen(__s);
  }
  local_28 = 0;
  uStack_20 = 0;
  if ((sVar3 != 0) &&
     (((bVar11 = *__s == L'{', !bVar11 || (__s[sVar3 - 1] == L'}')) &&
      (uVar4 = (ulong)bVar11, uVar4 < sVar3 - uVar4)))) {
    bVar9 = true;
    lVar5 = 0;
    uVar6 = 0;
    do {
      wVar2 = __s[uVar4 + lVar5];
      if (wVar2 != L'-') {
        if (0xf < uVar6) goto LAB_00173cc0;
        uVar1 = wVar2 + L'\xffffffd0';
        if (9 < uVar1) {
          bVar10 = false;
          if ((0x25 < (uint)(wVar2 + L'\xffffffbf')) ||
             ((0x3f0000003fU >> ((ulong)(uint)(wVar2 + L'\xffffffbf') & 0x3f) & 1) == 0))
          goto LAB_00173cc3;
        }
        cVar7 = (char)wVar2;
        if (bVar9) {
          if (uVar1 < 10) {
            cVar7 = cVar7 + -0x30;
          }
          else if ((uint)(wVar2 + L'\xffffff9f') < 6) {
            cVar7 = cVar7 + -0x57;
          }
          else if ((uint)(wVar2 + L'\xffffffbf') < 6) {
            cVar7 = cVar7 + -0x37;
          }
          else {
            cVar7 = '\0';
          }
          *(char *)((long)&local_28 + uVar6) = cVar7 << 4;
          bVar9 = false;
        }
        else {
          if (uVar1 < 10) {
            bVar8 = cVar7 - 0x30;
          }
          else if ((uint)(wVar2 + L'\xffffff9f') < 6) {
            bVar8 = cVar7 + 0xa9;
          }
          else if ((uint)(wVar2 + L'\xffffffbf') < 6) {
            bVar8 = cVar7 - 0x37;
          }
          else {
            bVar8 = 0;
          }
          *(byte *)((long)&local_28 + uVar6) = bVar8 | *(byte *)((long)&local_28 + uVar6);
          uVar6 = uVar6 + 1;
          bVar9 = true;
        }
      }
      lVar5 = lVar5 + 1;
    } while (sVar3 - (uint)bVar11 * 2 != lVar5);
    if (0xf < uVar6) {
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<uuids::uuid,_true,_true>)._M_payload.
        super__Optional_payload_base<uuids::uuid>._M_payload = local_28;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uuids::uuid,_true,_true>)._M_payload.
               super__Optional_payload_base<uuids::uuid>._M_payload + 8) = uStack_20;
      bVar10 = true;
      goto LAB_00173cc3;
    }
  }
LAB_00173cc0:
  bVar10 = false;
LAB_00173cc3:
  (__return_storage_ptr__->super__Optional_base<uuids::uuid,_true,_true>)._M_payload.
  super__Optional_payload_base<uuids::uuid>._M_engaged = bVar10;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] constexpr static std::optional<uuid> from_string(StringType const & in_str) noexcept
      {
         auto str = detail::to_string_view(in_str);
         bool firstDigit = true;
         size_t hasBraces = 0;
         size_t index = 0;

         std::array<uint8_t, 16> data{ { 0 } };

         if (str.empty()) return {};

         if (str.front() == '{')
            hasBraces = 1;
         if (hasBraces && str.back() != '}')
            return {};

         for (size_t i = hasBraces; i < str.size() - hasBraces; ++i)
         {
            if (str[i] == '-') continue;

            if (index >= 16 || !detail::is_hex(str[i]))
            {
               return {};
            }

            if (firstDigit)
            {
               data[index] = static_cast<uint8_t>(detail::hex2char(str[i]) << 4);
               firstDigit = false;
            }
            else
            {
               data[index] = static_cast<uint8_t>(data[index] | detail::hex2char(str[i]));
               index++;
               firstDigit = true;
            }
         }

         if (index < 16)
         {
            return {};
         }

         return uuid{ data };
      }